

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
DDSHeader::ToStringArray_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,DDSHeader *this)

{
  char *pcVar1;
  DDSInfo local_400 [32];
  DDSInfo local_3e0 [32];
  __cxx11 local_3c0 [32];
  DDSInfo local_3a0 [32];
  DDSInfo local_380 [32];
  __cxx11 local_360 [32];
  __cxx11 local_340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [32];
  uint32_t *local_300;
  uint32_t *value;
  uint32_t *__end1;
  uint32_t *__begin1;
  uint32_t (*__range1) [11];
  string reserved;
  __cxx11 local_2c0 [32];
  __cxx11 local_2a0 [32];
  DDSInfo local_280 [32];
  DDSInfo local_260 [32];
  __cxx11 local_240 [32];
  __cxx11 local_220 [32];
  __cxx11 local_200 [32];
  __cxx11 local_1e0 [32];
  __cxx11 local_1c0 [32];
  DDSInfo local_1a0 [32];
  __cxx11 local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  __cxx11 local_c0 [32];
  value_type local_a0 [32];
  DDSInfo local_80 [48];
  __cxx11 local_50 [32];
  FileHeaderDX10 *local_30;
  FileHeaderDX10 *dx10_impl;
  Impl *impl;
  DDSHeader *local_18;
  DDSHeader *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  
  impl._7_1_ = 0;
  local_18 = this;
  this_local = (DDSHeader *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  dx10_impl = (FileHeaderDX10 *)&this->impl_;
  local_30 = &this->dx10_impl_;
  std::__cxx11::to_string(local_50,(this->impl_).pixel_format.size);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  DDSInfo::PrintPixelFormatFlagNames_abi_cxx11_(local_80,dx10_impl[3].misc_flags_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  FourCCToString_abi_cxx11_((uint)local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::to_string(local_c0,dx10_impl[4].resource_dimension);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  pcVar1 = "True";
  if (dx10_impl[4].misc_flags == 0) {
    pcVar1 = "False";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,pcVar1,&local_e1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pcVar1 = "True";
  if (dx10_impl[4].misc_flags_2 == 0) {
    pcVar1 = "False";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,pcVar1,&local_109);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  pcVar1 = "True";
  if (dx10_impl[4].array_size == 0) {
    pcVar1 = "False";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,pcVar1,&local_131);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pcVar1 = "True";
  if (dx10_impl[5].dxgi_format == 0) {
    pcVar1 = "False";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,pcVar1,&local_159);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::to_string(local_180,dx10_impl->dxgi_format);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_180);
  std::__cxx11::string::~string((string *)local_180);
  DDSInfo::PrintDDSFlagNames_abi_cxx11_(local_1a0,dx10_impl->resource_dimension);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::to_string(local_1c0,dx10_impl->array_size);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_1c0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::to_string(local_1e0,dx10_impl->misc_flags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_1e0);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::to_string(local_200,dx10_impl[1].dxgi_format);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_200);
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::to_string(local_220,dx10_impl[1].resource_dimension);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_220);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::to_string(local_240,dx10_impl->misc_flags_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_240);
  std::__cxx11::string::~string((string *)local_240);
  DDSInfo::PrintCaps1FlagNames_abi_cxx11_(local_260,dx10_impl[5].resource_dimension);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_260);
  std::__cxx11::string::~string((string *)local_260);
  DDSInfo::PrintCaps2FlagNames_abi_cxx11_(local_280,dx10_impl[5].misc_flags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_280);
  std::__cxx11::string::~string((string *)local_280);
  std::__cxx11::to_string(local_2a0,dx10_impl[5].array_size);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_2a0);
  std::__cxx11::string::~string((string *)local_2a0);
  std::__cxx11::to_string(local_2c0,dx10_impl[5].misc_flags_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_2c0);
  std::__cxx11::string::~string((string *)local_2c0);
  std::__cxx11::string::string((string *)&__range1);
  value = &dx10_impl[3].array_size;
  __end1 = &dx10_impl[1].misc_flags;
  __begin1 = __end1;
  for (; __end1 != value; __end1 = __end1 + 1) {
    local_300 = __end1;
    std::__cxx11::to_string(local_340,*__end1);
    std::operator+(local_320,(char)local_340);
    std::__cxx11::string::append((string *)&__range1);
    std::__cxx11::string::~string((string *)local_320);
    std::__cxx11::string::~string((string *)local_340);
  }
  RemoveTrailingCharacter((string *)&__range1,':');
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)&__range1);
  std::__cxx11::to_string(local_360,dx10_impl[6].dxgi_format);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_360);
  std::__cxx11::string::~string((string *)local_360);
  DDSInfo::PrintDXGIFormatFlagNames_abi_cxx11_(local_380,local_30->dxgi_format);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_380);
  std::__cxx11::string::~string((string *)local_380);
  DDSInfo::PrintResourceDimensionFlagNames_abi_cxx11_(local_3a0,local_30->resource_dimension);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_3a0);
  std::__cxx11::string::~string((string *)local_3a0);
  std::__cxx11::to_string(local_3c0,local_30->array_size);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_3c0);
  std::__cxx11::string::~string((string *)local_3c0);
  DDSInfo::PrintTexMiscFlagNames_abi_cxx11_(local_3e0,local_30->misc_flags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_3e0);
  std::__cxx11::string::~string((string *)local_3e0);
  DDSInfo::PrintTexMisc2FlagNames_abi_cxx11_(local_400,local_30->misc_flags_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_400);
  std::__cxx11::string::~string((string *)local_400);
  impl._7_1_ = 1;
  std::__cxx11::string::~string((string *)&__range1);
  if ((impl._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> ToStringArray() {
    std::vector<std::string> output;
    const auto& impl(this->impl_);
    const auto& dx10_impl(this->dx10_impl_);
    output.push_back(std::to_string(impl.pixel_format.size));
    output.push_back(DDSInfo::PrintPixelFormatFlagNames(impl.pixel_format.flags));
    output.push_back(FourCCToString(impl.pixel_format.fourcc));
    output.push_back(std::to_string(impl.pixel_format.bit_count));
    output.push_back(impl.pixel_format.red_mask==0?"False":"True");
    output.push_back(impl.pixel_format.blue_mask==0?"False":"True");
    output.push_back(impl.pixel_format.green_mask==0?"False":"True");
    output.push_back(impl.pixel_format.alpha_mask==0?"False":"True");
    output.push_back(std::to_string(impl.size));
    output.push_back(DDSInfo::PrintDDSFlagNames(impl.flags));
    output.push_back(std::to_string(impl.width));
    output.push_back(std::to_string(impl.height));
    output.push_back(std::to_string(impl.depth));
    output.push_back(std::to_string(impl.mip_map_count));
    output.push_back(std::to_string(impl.pitch_or_linear_size));
    output.push_back(DDSInfo::PrintCaps1FlagNames(impl.capabilities1));
    output.push_back(DDSInfo::PrintCaps2FlagNames(impl.capabilities2));
    output.push_back(std::to_string(impl.capabilities3));
    output.push_back(std::to_string(impl.capabilities4));
    std::string reserved;
    for(auto& value: impl.reserved) {
      reserved.append(std::to_string(value) + ':');
    }
    RemoveTrailingCharacter(reserved,':');
    output.push_back(reserved);
    output.push_back(std::to_string(impl.reserved2));
    // DX 10
    output.push_back(DDSInfo::PrintDXGIFormatFlagNames(dx10_impl.dxgi_format));
    output.push_back(DDSInfo::PrintResourceDimensionFlagNames(dx10_impl.resource_dimension));
    output.push_back(std::to_string(dx10_impl.array_size));
    output.push_back(DDSInfo::PrintTexMiscFlagNames(dx10_impl.misc_flags));
    output.push_back(DDSInfo::PrintTexMisc2FlagNames(dx10_impl.misc_flags_2));
    return output;
    }